

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_styles.cpp
# Opt level: O1

void __thiscall Am_Style::Add_Image(Am_Style *this,Am_Image_Array *image)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Style_Data *this_00;
  Am_Image_Array local_30;
  
  if (this->data == (Am_Style_Data *)0x0) {
    this_00 = (Am_Style_Data *)operator_new(0x80);
    Am_Image_Array::Am_Image_Array(&local_30,0);
    Am_Style_Data::Am_Style_Data
              (this_00,0.0,0.0,0.0,0,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
               Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,&local_30);
    this->data = this_00;
    Am_Image_Array::~Am_Image_Array(&local_30);
  }
  else {
    iVar1 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])()
    ;
    this->data = (Am_Style_Data *)CONCAT44(extraout_var,iVar1);
  }
  Am_Image_Array::operator=(&this->data->stipple_bitmap,image);
  this->data->fill_solid = Am_FILL_STIPPLED;
  return;
}

Assistant:

void
Am_Style::Add_Image(Am_Image_Array image)
{
  if (data)
    data = (Am_Style_Data *)data->Make_Unique();
  else
    data = new Am_Style_Data(0.0, 0.0, 0.0, 0, Am_CAP_BUTT, Am_JOIN_MITER,
                             Am_LINE_SOLID, Am_DEFAULT_DASH_LIST,
                             Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_SOLID,
                             Am_FILL_POLY_EVEN_ODD, 0);
  data->stipple_bitmap = image;
  data->fill_solid = Am_FILL_STIPPLED;
}